

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O2

void acked(quicly_loss_t *loss,uint64_t pn,size_t epoch)

{
  uint32_t uVar1;
  uint uVar2;
  uint64_t uVar3;
  int64_t iVar4;
  int64_t iVar5;
  int iVar6;
  uint uVar7;
  quicly_sentmap_iter_t iter;
  
  quicly_loss_init_sentmap_iter(loss,&iter,now,0,0);
  while( true ) {
    if ((iter.p)->acked != quicly_sentmap__type_packet) {
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)"
                   );
    }
    uVar3 = ((iter.p)->data).packet.packet_number;
    if (uVar3 == pn) break;
    if (uVar3 == 0xffffffffffffffff) {
      __assert_fail("sent->packet_number != UINT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c"
                    ,0x29,"void acked(quicly_loss_t *, uint64_t, size_t)");
    }
    quicly_sentmap_skip(&iter);
  }
  iVar4 = ((iter.p)->data).packet.sent_at;
  iVar6 = quicly_sentmap_update(&loss->sentmap,&iter,QUICLY_SENTMAP_EVENT_ACKED);
  _ok((uint)(iVar6 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x2d);
  if ('\0' < loss->pto_count) {
    loss->pto_count = '\0';
  }
  iVar5 = now;
  if (loss->largest_acked_packet_plus1[epoch] <= pn) {
    loss->largest_acked_packet_plus1[epoch] = pn + 1;
    iVar6 = (int)iVar5 - (int)iVar4;
    if (iVar6 == -1) {
      __assert_fail("latest_rtt != UINT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0xc6,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
    }
    uVar7 = iVar6 + (uint)(iVar6 == 0);
    uVar1 = (loss->rtt).latest;
    (loss->rtt).latest = uVar7;
    if (uVar7 < (loss->rtt).minimum) {
      (loss->rtt).minimum = uVar7;
    }
    if (uVar1 == 0) {
      (loss->rtt).smoothed = uVar7;
      (loss->rtt).variance = uVar7 >> 1;
    }
    else {
      uVar2 = (loss->rtt).smoothed;
      iVar6 = uVar2 - uVar7;
      if (uVar2 < uVar7) {
        iVar6 = -(uVar2 - uVar7);
      }
      (loss->rtt).variance = (loss->rtt).variance * 3 + iVar6 >> 2;
      uVar7 = uVar2 * 7 + uVar7;
      (loss->rtt).smoothed = uVar7 >> 3;
      if (uVar7 < 8) {
        __assert_fail("rtt->smoothed != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0xda,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
      }
    }
  }
  return;
}

Assistant:

static void acked(quicly_loss_t *loss, uint64_t pn, size_t epoch)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    quicly_loss_init_sentmap_iter(loss, &iter, now, quicly_spec_context.transport_params.max_ack_delay, 0);
    while ((sent = quicly_sentmap_get(&iter))->packet_number != pn) {
        assert(sent->packet_number != UINT64_MAX);
        quicly_sentmap_skip(&iter);
    }
    int64_t sent_at = sent->sent_at;
    ok(quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);

    quicly_loss_on_ack_received(loss, pn, epoch, now, sent_at, 0, 1);
}